

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint64_t pbrt::Hash<pbrt::Vector3<float>>(Vector3<float> args)

{
  Vector3<float> v;
  uint64_t uVar1;
  undefined1 in_ZMM0 [64];
  undefined4 in_XMM1_Da;
  uint64_t buf [2];
  size_t n;
  size_t sz;
  float in_stack_ffffffffffffffb4;
  uchar local_48 [24];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_28 = 0xc;
  local_30 = 2;
  v.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_XMM1_Da;
  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)((ulong)local_20 >> 0x20);
  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffffb4;
  local_10 = local_20;
  hashRecursiveCopy<pbrt::Vector3<float>>((char *)0x65c55c,v);
  uVar1 = MurmurHash64A(local_48,0xc,0);
  return uVar1;
}

Assistant:

PBRT_CPU_GPU inline uint64_t Hash(Args... args) {
    // C++, you never cease to amaze: https://stackoverflow.com/a/57246704
    constexpr size_t sz = (sizeof(Args) + ... + 0);
    constexpr size_t n = (sz + 7) / 8;
    uint64_t buf[n];
    hashRecursiveCopy((char *)buf, args...);
    return MurmurHash64A((const unsigned char *)buf, sz, 0);
}